

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dielectric.hpp
# Opt level: O0

void __thiscall DielectricBRDF::sample_f(DielectricBRDF *this)

{
  Sampler *in_RDX;
  float *in_RSI;
  DielectricBRDF *unaff_retaddr;
  vec3f *in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  sample_f(unaff_retaddr,(Color *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
           in_stack_fffffffffffffff0,(vec3f *)this,in_RSI,in_RDX);
  return;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		float ior = wo.z>0? IOR: 1/IOR;
		float cost;
		float r = reflectivity(fabs(wo.z), cost, ior);

		if (r == 1 || sampler.get1f()<r) // reflected
		{
			wi = vec3f(-wo.x, -wo.y, wo.z);
			pdf = r;
			return r / fabs(wi.z);
		}
		else // transmitted
		{
			wi = vec3f(-wo.x/ior, -wo.y/ior, -wo.z * cost/fabs(wo.z));
			pdf = 1-r;
			return (1-r) / (fabs(wi.z) * ior * ior);
			// the 1/ior^2 coefficient is used to convert energy to radiance
			// see note_refract_radiance
		}
	}